

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  byte *pbVar3;
  bool bVar4;
  byte bVar5;
  stbi_uc sVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  float *output;
  stbi_uc *__ptr;
  stbi_uc *psVar11;
  long lVar12;
  stbi_uc *psVar13;
  byte bVar14;
  int iVar15;
  float *output_00;
  long lVar16;
  char *pcVar17;
  uint uVar18;
  ulong uVar19;
  int req_comp_00;
  byte bVar20;
  int iVar21;
  stbi_uc *psVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  float *local_490;
  char *local_448;
  byte local_440;
  byte local_43f;
  byte local_43e;
  stbi_uc local_43d;
  stbi_uc local_43c [4];
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  stbi__hdr_gettoken(s,&local_438);
  if (CONCAT17(cStack_42e,
               CONCAT16(cStack_42f,
                        CONCAT15(cStack_430,
                                 CONCAT14(cStack_431,
                                          CONCAT13(cStack_432,
                                                   CONCAT12(cStack_433,
                                                            CONCAT11(cStack_434,cStack_435))))))) ==
      0x45434e41494441 &&
      CONCAT17(cStack_431,
               CONCAT16(cStack_432,
                        CONCAT15(cStack_433,
                                 CONCAT14(cStack_434,
                                          CONCAT13(cStack_435,
                                                   CONCAT12(cStack_436,
                                                            CONCAT11(cStack_437,local_438))))))) ==
      0x4e41494441523f23) {
    stbi__hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      bVar4 = false;
      do {
        auVar24[0] = -(cStack_431 == '3');
        auVar24[1] = -(cStack_430 == '2');
        auVar24[2] = -(cStack_42f == '-');
        auVar24[3] = -(cStack_42e == 'b');
        auVar24[4] = -(cStack_42d == 'i');
        auVar24[5] = -(cStack_42c == 't');
        auVar24[6] = -(cStack_42b == '_');
        auVar24[7] = -(cStack_42a == 'r');
        auVar24[8] = -(cStack_429 == 'l');
        auVar24[9] = -(cStack_428 == 'e');
        auVar24[10] = -(cStack_427 == '_');
        auVar24[0xb] = -(cStack_426 == 'r');
        auVar24[0xc] = -(cStack_425 == 'g');
        auVar24[0xd] = -(cStack_424 == 'b');
        auVar24[0xe] = -(cStack_423 == 'e');
        auVar24[0xf] = -(cStack_422 == '\0');
        auVar25[0] = -(local_438 == 'F');
        auVar25[1] = -(cStack_437 == 'O');
        auVar25[2] = -(cStack_436 == 'R');
        auVar25[3] = -(cStack_435 == 'M');
        auVar25[4] = -(cStack_434 == 'A');
        auVar25[5] = -(cStack_433 == 'T');
        auVar25[6] = -(cStack_432 == '=');
        auVar25[7] = -(cStack_431 == '3');
        auVar25[8] = -(cStack_430 == '2');
        auVar25[9] = -(cStack_42f == '-');
        auVar25[10] = -(cStack_42e == 'b');
        auVar25[0xb] = -(cStack_42d == 'i');
        auVar25[0xc] = -(cStack_42c == 't');
        auVar25[0xd] = -(cStack_42b == '_');
        auVar25[0xe] = -(cStack_42a == 'r');
        auVar25[0xf] = -(cStack_429 == 'l');
        auVar25 = auVar25 & auVar24;
        if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff) {
          bVar4 = true;
        }
        stbi__hdr_gettoken(s,&local_438);
      } while (local_438 != '\0');
      if (bVar4) {
        stbi__hdr_gettoken(s,&local_438);
        if (cStack_436 == ' ' && CONCAT11(cStack_437,local_438) == 0x592d) {
          local_448 = &cStack_435;
          uVar9 = strtol(local_448,&local_448,10);
          local_448 = local_448 + 2;
          do {
            pcVar17 = local_448;
            local_448 = pcVar17 + 1;
          } while (pcVar17[-2] == ' ');
          if (((pcVar17[-2] == '+') && (pcVar17[-1] == 'X')) && (*pcVar17 == ' ')) {
            uVar10 = strtol(local_448,(char **)0x0,10);
            uVar7 = (uint)uVar10;
            *x = uVar7;
            iVar21 = (int)uVar9;
            *y = iVar21;
            if (comp != (int *)0x0) {
              *comp = 3;
            }
            req_comp_00 = 3;
            if (req_comp != 0) {
              req_comp_00 = req_comp;
            }
            output = (float *)malloc((long)(int)(iVar21 * uVar7 * req_comp_00) << 2);
            iVar15 = 0;
            if (uVar7 - 0x8000 < 0xffff8008) goto LAB_00164cf0;
            if (iVar21 < 1) {
              __ptr = (stbi_uc *)0x0;
            }
            else {
              psVar1 = s->buffer_start;
              psVar2 = s->buffer_start + 1;
              uVar19 = 0;
              __ptr = (stbi_uc *)0x0;
              local_490 = output;
              do {
                psVar22 = s->img_buffer;
                psVar11 = s->img_buffer_end;
                if (psVar22 < psVar11) {
                  s->img_buffer = psVar22 + 1;
                  bVar5 = *psVar22;
                  psVar22 = psVar22 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar5 = 0;
                }
                else {
                  iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                  if (iVar15 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar5 = 0;
                    psVar11 = psVar2;
                  }
                  else {
                    bVar5 = *psVar1;
                    psVar11 = psVar1 + iVar15;
                  }
                  s->img_buffer_end = psVar11;
                  s->img_buffer = psVar2;
                  psVar22 = psVar2;
                }
                if (psVar22 < psVar11) {
                  s->img_buffer = psVar22 + 1;
                  bVar20 = *psVar22;
                  psVar22 = psVar22 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar20 = 0;
                }
                else {
                  iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                  if (iVar15 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar20 = 0;
                    psVar11 = psVar2;
                  }
                  else {
                    bVar20 = *psVar1;
                    psVar11 = psVar1 + iVar15;
                  }
                  s->img_buffer_end = psVar11;
                  s->img_buffer = psVar2;
                  psVar22 = psVar2;
                }
                if (psVar22 < psVar11) {
                  s->img_buffer = psVar22 + 1;
                  bVar14 = *psVar22;
                  psVar22 = psVar22 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar14 = 0;
                }
                else {
                  iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                  if (iVar15 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar14 = 0;
                    psVar11 = psVar2;
                  }
                  else {
                    bVar14 = *psVar1;
                    psVar11 = psVar1 + iVar15;
                  }
                  s->img_buffer_end = psVar11;
                  s->img_buffer = psVar2;
                  psVar22 = psVar2;
                }
                if (((bVar5 != 2) || (bVar20 != 2)) || ((char)bVar14 < '\0')) {
                  local_440 = bVar5;
                  local_43f = bVar20;
                  local_43e = bVar14;
                  local_43d = stbi__get8(s);
                  stbi__hdr_convert(output,&local_440,req_comp_00);
                  free(__ptr);
                  iVar15 = 0;
                  iVar8 = 1;
                  do {
                    stbi__getn(s,local_43c,4);
                    stbi__hdr_convert(output + (long)(int)(req_comp_00 * uVar7 * iVar15) +
                                               (long)(iVar8 * req_comp_00),local_43c,req_comp_00);
                    iVar8 = iVar8 + 1;
                    while ((int)uVar7 <= iVar8) {
                      iVar15 = iVar15 + 1;
LAB_00164cf0:
                      iVar8 = 0;
                      if (iVar21 <= iVar15) {
                        return output;
                      }
                    }
                  } while( true );
                }
                if (psVar22 < psVar11) {
                  s->img_buffer = psVar22 + 1;
                  bVar5 = *psVar22;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar5 = 0;
                }
                else {
                  iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                  if (iVar15 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar5 = 0;
                    psVar22 = psVar2;
                  }
                  else {
                    bVar5 = *psVar1;
                    psVar22 = psVar1 + iVar15;
                  }
                  s->img_buffer_end = psVar22;
                  s->img_buffer = psVar2;
                }
                if (CONCAT11(bVar14,bVar5) != uVar7) {
                  free(output);
                  free(__ptr);
                  stbi__g_failure_reason = "invalid decoded scanline length";
                  return (float *)0x0;
                }
                if (__ptr == (stbi_uc *)0x0) {
                  __ptr = (stbi_uc *)malloc((ulong)(uVar7 * 4));
                }
                lVar12 = 0;
                psVar22 = __ptr;
                do {
                  iVar15 = 0;
                  do {
                    pbVar3 = s->img_buffer;
                    psVar11 = s->img_buffer_end;
                    if (pbVar3 < psVar11) {
                      s->img_buffer = pbVar3 + 1;
                      uVar18 = (uint)*pbVar3;
                      psVar13 = pbVar3 + 1;
LAB_00164a94:
                      if ((byte)uVar18 < 0x81) {
                        if ((byte)uVar18 != 0) {
                          lVar16 = 0;
                          do {
                            psVar11 = s->img_buffer;
                            if (psVar11 < s->img_buffer_end) {
                              s->img_buffer = psVar11 + 1;
                              sVar6 = *psVar11;
                            }
                            else if (s->read_from_callbacks == 0) {
                              sVar6 = '\0';
                            }
                            else {
                              iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                              if (iVar8 == 0) {
                                s->read_from_callbacks = 0;
                                s->buffer_start[0] = '\0';
                                sVar6 = '\0';
                                psVar11 = psVar2;
                              }
                              else {
                                sVar6 = *psVar1;
                                psVar11 = psVar1 + iVar8;
                              }
                              s->img_buffer_end = psVar11;
                              s->img_buffer = psVar2;
                            }
                            psVar22[lVar16 * 4 + (long)iVar15 * 4] = sVar6;
                            lVar16 = lVar16 + 1;
                          } while (uVar18 != (uint)lVar16);
                          iVar15 = iVar15 + (uint)lVar16;
                        }
                      }
                      else {
                        if (psVar13 < psVar11) {
                          s->img_buffer = psVar13 + 1;
                          bVar5 = *psVar13;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar5 = 0;
                        }
                        else {
                          iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                          if (iVar8 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar5 = 0;
                            psVar11 = psVar2;
                          }
                          else {
                            bVar5 = *psVar1;
                            psVar11 = psVar1 + iVar8;
                          }
                          s->img_buffer_end = psVar11;
                          s->img_buffer = psVar2;
                        }
                        if ((uVar18 & 0x7f) != 0) {
                          lVar16 = 0;
                          do {
                            psVar22[lVar16 * 4 + (long)iVar15 * 4] = bVar5;
                            lVar16 = lVar16 + 1;
                          } while ((uVar18 & 0x7f) != (uint)lVar16);
                          iVar15 = iVar15 + (uint)lVar16;
                        }
                      }
                    }
                    else if (s->read_from_callbacks != 0) {
                      iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                      if (iVar8 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        uVar18 = 0;
                        psVar11 = psVar2;
                      }
                      else {
                        uVar18 = (uint)*psVar1;
                        psVar11 = psVar1 + iVar8;
                      }
                      s->img_buffer_end = psVar11;
                      s->img_buffer = psVar2;
                      psVar13 = psVar2;
                      goto LAB_00164a94;
                    }
                  } while (iVar15 < (int)uVar7);
                  lVar12 = lVar12 + 1;
                  psVar22 = psVar22 + 1;
                  output_00 = local_490;
                  psVar11 = __ptr;
                  uVar23 = uVar10 & 0x7fffffff;
                } while (lVar12 != 4);
                do {
                  stbi__hdr_convert(output_00,psVar11,req_comp_00);
                  uVar23 = uVar23 - 1;
                  output_00 = output_00 + req_comp_00;
                  psVar11 = psVar11 + 4;
                } while (uVar23 != 0);
                uVar19 = uVar19 + 1;
                local_490 = local_490 + (uVar10 & 0xffffffff) * (long)req_comp_00;
              } while (uVar19 != (uVar9 & 0x7fffffff));
            }
            free(__ptr);
            return output;
          }
        }
        stbi__g_failure_reason = "unsupported data layout";
        return (float *)0x0;
      }
    }
    stbi__g_failure_reason = "unsupported format";
  }
  else {
    stbi__g_failure_reason = "not HDR";
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;


   // Check identifier
   if (strcmp(stbi__hdr_gettoken(s,buffer), "#?RADIANCE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   // Read data
   hdr_data = (float *) stbi__malloc(height * width * req_comp * sizeof(float));

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) scanline = (stbi_uc *) stbi__malloc(width * 4);

         for (k = 0; k < 4; ++k) {
            i = 0;
            while (i < width) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      STBI_FREE(scanline);
   }

   return hdr_data;
}